

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_mod_nims(nt_opts *opts)

{
  nifti_image *nim_00;
  int iVar1;
  size_t sVar2;
  undefined8 local_31;
  char func [13];
  int filec;
  nifti_image *nim;
  nt_opts *opts_local;
  
  local_31 = 0x5f646f6d5f746361;
  builtin_strncpy(func,"nims",5);
  if (2 < g_debug) {
    fprintf(_stderr,"-d modifying %d fields for %d nifti images...\n",(ulong)(uint)(opts->flist).len
            ,(ulong)(uint)(opts->infiles).len);
  }
  if ((0 < (opts->flist).len) && (0 < (opts->infiles).len)) {
    func[5] = '\0';
    func[6] = '\0';
    func[7] = '\0';
    func[8] = '\0';
    for (; (int)func._5_4_ < (opts->infiles).len; func._5_4_ = func._5_4_ + 1) {
      register0x00000000 = nt_image_read(opts,(opts->infiles).list[(int)func._5_4_],1);
      if (1 < g_debug) {
        fprintf(_stderr,"-d modifying %d fields from \'%s\' image\n",(ulong)(uint)(opts->flist).len,
                (opts->infiles).list[(int)func._5_4_]);
      }
      iVar1 = modify_all_fields(stack0xffffffffffffffe0,opts,g_nim_fields,0x3f);
      nim_00 = stack0xffffffffffffffe0;
      if (iVar1 != 0) {
        nifti_image_free(stack0xffffffffffffffe0);
        return 1;
      }
      if (opts->keep_hist != 0) {
        sVar2 = strlen(opts->command);
        iVar1 = nifti_add_extension(nim_00,opts->command,(int)sVar2,6);
        if (iVar1 != 0) {
          fprintf(_stderr,"** failed to add command to image as extension\n");
        }
      }
      if ((opts->prefix != (char *)0x0) &&
         (iVar1 = nifti_set_filenames(stack0xffffffffffffffe0,opts->prefix,1,1), iVar1 != 0)) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",&local_31,"failed to set prefix for new file: "
                ,opts->prefix);
        nifti_image_free(stack0xffffffffffffffe0);
        return 1;
      }
      nifti_image_write(stack0xffffffffffffffe0);
      nifti_image_free(stack0xffffffffffffffe0);
    }
  }
  return 0;
}

Assistant:

int act_mod_nims( nt_opts * opts )
{
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec;
   char             func[] = { "act_mod_nims" };

   if( g_debug > 2 )
      fprintf(stderr,"-d modifying %d fields for %d nifti images...\n",
              opts->flist.len, opts->infiles.len);
   if( opts->flist.len <= 0 || opts->infiles.len <= 0 ) return 0;

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[filec], 1); /* with data */

      if( g_debug > 1 )
         fprintf(stderr,"-d modifying %d fields from '%s' image\n",
                 opts->flist.len, opts->infiles.list[filec]);

      /* okay, let's actually trash the data fields */
      if( modify_all_fields(nim, opts, g_nim_fields, NT_NIM_NUM_FIELDS) )
      {
         nifti_image_free(nim);
         return 1;
      }

      /* add command as COMMENT extension */
      if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                             strlen(opts->command), NIFTI_ECODE_COMMENT) )
         fprintf(stderr,"** failed to add command to image as extension\n");

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }

      nifti_image_write(nim);  /* and write it out, piece of cake :) */
      nifti_image_free(nim);
   }

   return 0;
}